

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_hasIndex(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  bool *pbVar2;
  ListStorage<MiniScript::TACLine> *pLVar3;
  bool bVar4;
  int32_t iVar5;
  uint uVar6;
  anon_union_8_3_2f476f46_for_data aVar7;
  _func_int **pp_Var8;
  Context *pCVar9;
  undefined4 *puVar10;
  long lVar11;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *pHVar12;
  Value index;
  Value self;
  ValueDict map;
  undefined1 local_e0 [8];
  anon_union_8_3_2f476f46_for_data local_d8;
  undefined1 local_d0 [16];
  ValueDict local_c0;
  Value local_a8;
  Value local_98;
  Context *local_88;
  bool local_80;
  anon_union_8_3_2f476f46_for_data local_78;
  ValueType local_70;
  anon_union_8_3_2f476f46_for_data local_68;
  Machine *local_60;
  Value local_58;
  Value local_48 [2];
  
  local_70 = Null;
  aVar7.ref = (RefCountedStorage *)operator_new(0x30);
  (aVar7.ref)->refCount = 1;
  (aVar7.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
  aVar7.ref[1].refCount = 5;
  aVar7.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
  pp_Var8 = (_func_int **)operator_new__(5);
  aVar7.ref[1]._vptr_RefCountedStorage = pp_Var8;
  *(undefined1 *)((long)pp_Var8 + 4) = 0;
  *(undefined4 *)pp_Var8 = 0x666c6573;
  local_78.ref = aVar7.ref;
  Context::GetVar((Context *)local_d0,(String *)partialResult.rs,(LocalOnlyMode)&local_78);
  if ((local_78.ref != (RefCountedStorage *)0x0) && (local_70 == Null)) {
    plVar1 = &(local_78.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_78.ref)->_vptr_RefCountedStorage[1])();
    }
    local_78.number = 0.0;
  }
  local_80 = false;
  pCVar9 = (Context *)operator_new(0x30);
  ((RefCountedStorage *)&pCVar9->code)->refCount = 1;
  ((RefCountedStorage *)&pCVar9->code)->_vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001d10b0;
  (pCVar9->variables)._vptr_Dictionary = (_func_int **)0x6;
  (pCVar9->variables).ds =
       (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar10 = (undefined4 *)operator_new__(6);
  ((SimpleVector<MiniScript::Value> *)&pCVar9->lineNum)->mBlockItems = (unsigned_long)puVar10;
  *(undefined2 *)(puVar10 + 1) = 0x78;
  *puVar10 = 0x65646e69;
  local_88 = pCVar9;
  Context::GetVar((Context *)local_e0,(String *)partialResult.rs,(LocalOnlyMode)&local_88);
  if ((local_88 != (Context *)0x0) && (local_80 == false)) {
    plVar1 = &((RefCountedStorage *)&local_88->code)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((RefCountedStorage *)&local_88->code)->_vptr_RefCountedStorage[1])();
    }
    local_88 = (Context *)0x0;
  }
  aVar7 = (anon_union_8_3_2f476f46_for_data)local_d0._8_8_;
  if (local_d0[0] == String) {
    if (local_e0[0] != Number) {
      local_a8.type = Value::zero;
      local_a8.noInvoke = DAT_001d32e1;
      local_a8.localOnly = DAT_001d32e2;
      local_a8.data.ref = DAT_001d32e8;
      if ((Temp < Value::zero) && (DAT_001d32e8 != (RefCountedStorage *)0x0)) {
        DAT_001d32e8->refCount = DAT_001d32e8->refCount + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,&local_a8);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_a8.type) && (local_a8.data.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_a8.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_a8.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_a8.data.number = 0.0;
      }
      goto LAB_0014efe0;
    }
    if ((StringStorage *)local_d0._8_8_ == (StringStorage *)0x0) {
      aVar7.number = 0.0;
    }
    else {
      *(long *)(local_d0._8_8_ + 8) = *(long *)(local_d0._8_8_ + 8) + 1;
    }
    iVar5 = Value::IntValue((Value *)local_e0);
    if ((StringStorage *)aVar7.ref == (StringStorage *)0x0) {
      pp_Var8 = (_func_int **)0x0;
    }
    else {
      if ((long)aVar7.ref[2]._vptr_RefCountedStorage < 0) {
        StringStorage::analyzeChars((StringStorage *)aVar7.ref);
      }
      pp_Var8 = aVar7.ref[2]._vptr_RefCountedStorage;
    }
    lVar11 = (long)iVar5;
    if (SBORROW8(lVar11,-(long)pp_Var8) == lVar11 + (long)pp_Var8 < 0) {
      if ((StringStorage *)aVar7.ref == (StringStorage *)0x0) {
        pp_Var8 = (_func_int **)0x0;
      }
      else {
        if ((long)aVar7.ref[2]._vptr_RefCountedStorage < 0) {
          StringStorage::analyzeChars((StringStorage *)aVar7.ref);
        }
        pp_Var8 = aVar7.ref[2]._vptr_RefCountedStorage;
      }
      bVar4 = lVar11 < (long)pp_Var8;
    }
    else {
      bVar4 = false;
    }
    Value::Truth(&local_58,bVar4);
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_58);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_58.type) && (local_58.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_58.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_58.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_58.data.number = 0.0;
    }
  }
  else {
    if (local_d0[0] == Map) {
      Value::GetDict(&local_c0,(Value *)local_d0);
      if (local_c0.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
        bVar4 = false;
      }
      else {
        uVar6 = HashValue((Value *)local_e0);
        pHVar12 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)
                  ((local_c0.ds)->mTable + uVar6 % 0xfb);
        do {
          pHVar12 = pHVar12->next;
          bVar4 = pHVar12 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0;
          if (pHVar12 == (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0)
          goto LAB_0014edc4;
          bVar4 = Value::operator==(&pHVar12->key,(Value *)local_e0);
        } while (!bVar4);
        bVar4 = true;
      }
LAB_0014edc4:
      Value::Truth((Value *)&local_68,bVar4);
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,(Value *)&local_68);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((2 < (byte)local_68.tempNum._0_1_) && (local_60 != (Machine *)0x0)) {
        pbVar2 = &local_60->storeImplicit;
        *(long *)pbVar2 = *(long *)pbVar2 + -1;
        if (*(long *)pbVar2 == 0) {
          (**(code **)(local_60->standardOutput + 8))();
        }
        local_60 = (Machine *)0x0;
      }
      local_c0._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001d1238;
      if ((local_c0.ds != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
         (local_c0.isTemp == false)) {
        plVar1 = &((local_c0.ds)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_c0.ds)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_c0.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
      goto LAB_0014efe0;
    }
    if (local_d0[0] != List) {
      IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
      pLVar3 = IntrinsicResult::Null;
      (context->code).ls = IntrinsicResult::Null;
      if (pLVar3 != (ListStorage<MiniScript::TACLine> *)0x0) {
        plVar1 = &(pLVar3->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + 1;
      }
      goto LAB_0014efe0;
    }
    if (local_e0[0] != Number) {
      local_98.type = Value::zero;
      local_98.noInvoke = DAT_001d32e1;
      local_98.localOnly = DAT_001d32e2;
      local_98.data.ref = DAT_001d32e8;
      if ((Temp < Value::zero) && (DAT_001d32e8 != (RefCountedStorage *)0x0)) {
        DAT_001d32e8->refCount = DAT_001d32e8->refCount + 1;
      }
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,&local_98);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_98.type) && (local_98.data.ref != (RefCountedStorage *)0x0)) {
        plVar1 = &(local_98.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_98.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_98.data.number = 0.0;
      }
      goto LAB_0014efe0;
    }
    if ((StringStorage *)local_d0._8_8_ != (StringStorage *)0x0) {
      *(long *)(local_d0._8_8_ + 8) = *(long *)(local_d0._8_8_ + 8) + 1;
    }
    iVar5 = Value::IntValue((Value *)local_e0);
    lVar11 = (long)iVar5;
    if ((StringStorage *)aVar7.ref == (StringStorage *)0x0) {
      pp_Var8 = (_func_int **)0x0;
    }
    else {
      pp_Var8 = aVar7.ref[2]._vptr_RefCountedStorage;
    }
    if (SBORROW8(lVar11,-(long)pp_Var8) == lVar11 + (long)pp_Var8 < 0) {
      if ((StringStorage *)aVar7.ref == (StringStorage *)0x0) {
        pp_Var8 = (_func_int **)0x0;
      }
      else {
        pp_Var8 = aVar7.ref[2]._vptr_RefCountedStorage;
      }
      bVar4 = lVar11 < (long)pp_Var8;
    }
    else {
      bVar4 = false;
    }
    Value::Truth(local_48,bVar4);
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     local_48);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_48[0].type) && (local_48[0].data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_48[0].data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_48[0].data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_48[0].data.number = 0.0;
    }
  }
  if ((StringStorage *)aVar7.ref != (StringStorage *)0x0) {
    plVar1 = &(aVar7.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((RefCountedStorage *)&(aVar7.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage[1])
                (aVar7.number);
    }
  }
LAB_0014efe0:
  if ((Temp < local_e0[0]) && (local_d8.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_d8.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_d8.ref)->_vptr_RefCountedStorage[1])();
    }
    local_d8.number = 0.0;
  }
  if ((Temp < local_d0[0]) && ((StringStorage *)local_d0._8_8_ != (StringStorage *)0x0)) {
    plVar1 = (long *)(local_d0._8_8_ + 8);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((RefCountedStorage *)local_d0._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_hasIndex(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value index = context->GetVar("index");
		if (self.type == ValueType::List) {
			if (index.type == ValueType::Number) {
				ValueList list = self.GetList();
				long i = index.IntValue();
				return IntrinsicResult(Value::Truth(i >= -list.Count() and i < list.Count()));
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::String) {
			if (index.type == ValueType::Number) {
				String str = self.GetString();
				long i = index.IntValue();
				return IntrinsicResult(Value::Truth(i >= -str.Length() and i < str.Length()));
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::Map) {
			ValueDict map = self.GetDict();
			return IntrinsicResult(Value::Truth(map.ContainsKey(index)));
		}
		return IntrinsicResult::Null;
	}